

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

MPP_RET mpp_enc_refs_get_cpb_info(MppEncRefs refs,MppEncCpbInfo *info)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  MPP_RET MVar8;
  
  if (refs == (MppEncRefs)0x0 || info == (MppEncCpbInfo *)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid input refs %p info %p\n","mpp_enc_refs_get_cpb_info",refs,
               info);
    MVar8 = MPP_ERR_VALUE;
  }
  else {
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb_info",refs);
    }
    RVar1 = *(RK_S32 *)((long)refs + 0x40);
    RVar2 = *(RK_S32 *)((long)refs + 0x44);
    RVar3 = *(RK_S32 *)((long)refs + 0x48);
    RVar4 = *(RK_S32 *)((long)refs + 0x4c);
    RVar5 = *(RK_S32 *)((long)refs + 0x50);
    RVar6 = *(RK_S32 *)((long)refs + 0x54);
    RVar7 = *(RK_S32 *)((long)refs + 0x58);
    info->max_lt_idx = *(RK_S32 *)((long)refs + 0x4c);
    info->max_st_tid = RVar5;
    info->lt_gop = RVar6;
    info->st_gop = RVar7;
    info->dpb_size = RVar1;
    info->max_lt_cnt = RVar2;
    info->max_st_cnt = RVar3;
    info->max_lt_idx = RVar4;
    MVar8 = MPP_OK;
    if (((byte)enc_refs_debug & 1) != 0) {
      MVar8 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb_info",refs);
    }
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb_info(MppEncRefs refs, MppEncCpbInfo *info)
{
    if (NULL == refs || NULL == info) {
        mpp_err_f("invalid input refs %p info %p\n", refs, info);
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    memcpy(info, &p->cpb.info, sizeof(*info));

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}